

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O1

FSerializer * Serialize(FSerializer *arc,char *key,FState **state,FState **def,bool *retcode)

{
  uint16_t uVar1;
  uint uVar2;
  char cVar3;
  Value *this;
  PClassActor *pPVar4;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this_00;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *pGVar5;
  Ch *pCVar6;
  char *name;
  FWriter *pFVar7;
  
  if (retcode != (bool *)0x0) {
    *retcode = false;
  }
  pFVar7 = arc->w;
  if (pFVar7 == (FWriter *)0x0) {
    this = FReader::FindKey(arc->r,key);
    if (this != (Value *)0x0) {
      uVar1 = (this->data_).f.flags;
      if (uVar1 == 4) {
        if (retcode != (bool *)0x0) {
          *retcode = true;
        }
        this_00 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::operator[](this,0);
        pGVar5 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::operator[](this,1);
        *state = (FState *)0x0;
        if (((*(byte *)((long)&this_00->data_ + 0x17) & 4) == 0) ||
           ((*(byte *)((long)&pGVar5->data_ + 0x16) & 0x40) == 0)) {
          __assert_fail("cls.IsString() && ndx.IsUint()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/serializer.cpp"
                        ,0x79e,
                        "FSerializer &Serialize(FSerializer &, const char *, FState *&, FState **, bool *)"
                       );
        }
        pCVar6 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::GetString(this_00);
        name = UnicodeToString(pCVar6);
        pPVar4 = PClass::FindActor(name);
        if (pPVar4 != (PClassActor *)0x0) {
          if ((*(byte *)((long)&pGVar5->data_ + 0x16) & 0x40) == 0) {
            __assert_fail("data_.f.flags & kUintFlag",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/rapidjson/document.h"
                          ,0x66e,
                          "unsigned int rapidjson::GenericValue<rapidjson::UTF8<>>::GetUint() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                         );
          }
          uVar2 = (pGVar5->data_).s.length;
          if (uVar2 < (uint)pPVar4->NumOwnedStates) {
            *state = pPVar4->OwnedStates + uVar2;
            return arc;
          }
        }
        *state = (FState *)0x0;
        pCVar6 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::GetString(this_00);
        if ((*(byte *)((long)&pGVar5->data_ + 0x16) & 0x20) == 0) {
          __assert_fail("data_.f.flags & kIntFlag",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/rapidjson/document.h"
                        ,0x66d,
                        "int rapidjson::GenericValue<rapidjson::UTF8<>>::GetInt() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                       );
        }
        Printf("\x1cIInvalid state \'%s+%d\' for \'%s\'",pCVar6,(ulong)(pGVar5->data_).s.length,key)
        ;
      }
      else if (uVar1 == 0) {
        if (retcode != (bool *)0x0) {
          *retcode = true;
        }
        *state = (FState *)0x0;
      }
      else if (retcode == (bool *)0x0) {
        __assert_fail("false && \"not an array\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/serializer.cpp"
                      ,0x7b6,
                      "FSerializer &Serialize(FSerializer &, const char *, FState *&, FState **, bool *)"
                     );
      }
    }
  }
  else {
    uVar2 = (pFVar7->mInObject).Count;
    if (uVar2 == 0) {
      cVar3 = '\0';
    }
    else {
      cVar3 = (pFVar7->mInObject).Array[uVar2 - 1];
    }
    if (((def == (FState **)0x0) || (cVar3 == '\0')) || (*state != *def)) {
      if (retcode != (bool *)0x0) {
        *retcode = true;
      }
      FSerializer::WriteKey(arc,key);
      if (*state == (FState *)0x0) {
        pFVar7 = arc->w;
      }
      else {
        pPVar4 = FState::StaticFindStateOwner(*state);
        pFVar7 = arc->w;
        if (pPVar4 != (PClassActor *)0x0) {
          FWriter::StartArray(pFVar7);
          FWriter::String(arc->w,FName::NameData.NameArray
                                 [(pPVar4->super_PClass).super_PNativeStruct.super_PStruct.
                                  super_PNamedType.TypeName.Index].Text);
          FWriter::Uint(arc->w,(int)((ulong)((long)*state - (long)pPVar4->OwnedStates) >> 3) *
                               -0x33333333);
          FWriter::EndArray(arc->w);
          return arc;
        }
      }
      FWriter::Null(pFVar7);
    }
  }
  return arc;
}

Assistant:

FSerializer &Serialize(FSerializer &arc, const char *key, FState *&state, FState **def, bool *retcode)
{
	if (retcode) *retcode = false;
	if (arc.isWriting())
	{
		if (!arc.w->inObject() || def == nullptr || state != *def)
		{
			if (retcode) *retcode = true;
			arc.WriteKey(key);
			if (state == nullptr)
			{
				arc.w->Null();
			}
			else
			{
				PClassActor *info = FState::StaticFindStateOwner(state);

				if (info != NULL)
				{
					arc.w->StartArray();
					arc.w->String(info->TypeName.GetChars());
					arc.w->Uint((uint32_t)(state - info->OwnedStates));
					arc.w->EndArray();
				}
				else
				{
					arc.w->Null();
				}
			}
		}
	}
	else
	{
		auto val = arc.r->FindKey(key);
		if (val != nullptr)
		{
			if (val->IsNull())
			{
				if (retcode) *retcode = true;
				state = nullptr;
			}
			else if (val->IsArray())
			{
				if (retcode) *retcode = true;
				const rapidjson::Value &cls = (*val)[0];
				const rapidjson::Value &ndx = (*val)[1];

				state = nullptr;
				assert(cls.IsString() && ndx.IsUint());
				if (cls.IsString() && ndx.IsUint())
				{
					PClassActor *clas = PClass::FindActor(UnicodeToString(cls.GetString()));
					if (clas && ndx.GetUint() < (unsigned)clas->NumOwnedStates)
					{
						state = clas->OwnedStates + ndx.GetUint();
					}
					else
					{
						// this can actually happen by changing the DECORATE so treat it as a warning, not an error.
						state = nullptr;
						Printf(TEXTCOLOR_ORANGE "Invalid state '%s+%d' for '%s'", cls.GetString(), ndx.GetInt(), key);
					}
				}
				else
				{
					assert(false && "not a state");
					Printf(TEXTCOLOR_RED "data does not represent a state for '%s'", key);
					arc.mErrors++;
				}
			}
			else if (!retcode)
			{
				assert(false && "not an array");
				Printf(TEXTCOLOR_RED "array type expected for '%s'", key);
				arc.mErrors++;
			}
		}
	}
	return arc;

}